

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O0

void __thiscall
cfgfile::
tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::on_finish(tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *this,parser_info_t<cfgfile::string_trait_t> *info)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference pptVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string_t *what;
  parser_info_t<cfgfile::string_trait_t> *in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  tag_t<cfgfile::string_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range2;
  string *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  exception_t<cfgfile::string_trait_t> *this_00;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffd08;
  allocator *__lhs;
  allocator local_2c1;
  string local_2c0 [103];
  undefined1 local_259 [72];
  allocator local_211;
  string local_210 [71];
  allocator local_1c9;
  string local_1c8 [87];
  allocator local_171;
  string local_170 [320];
  tag_t<cfgfile::string_trait_t> *local_30;
  tag_t<cfgfile::string_trait_t> **local_28;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  local_20;
  undefined8 local_18;
  parser_info_t<cfgfile::string_trait_t> *local_10;
  
  local_10 = in_RSI;
  iVar2 = (*in_RDI->_vptr_tag_t[2])();
  local_18 = CONCAT44(extraout_var,iVar2);
  local_20._M_current =
       (tag_t<cfgfile::string_trait_t> **)
       std::
       vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
       ::begin((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                *)in_stack_fffffffffffffce8);
  local_28 = (tag_t<cfgfile::string_trait_t> **)
             std::
             vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
             ::end((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                    *)in_stack_fffffffffffffce8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                        *)in_stack_fffffffffffffcf0,
                       (__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                        *)in_stack_fffffffffffffce8);
    if (!bVar1) {
      return;
    }
    pptVar3 = __gnu_cxx::
              __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
              ::operator*(&local_20);
    local_30 = *pptVar3;
    bVar1 = tag_t<cfgfile::string_trait_t>::is_mandatory(local_30);
    if ((bVar1) &&
       (bVar1 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_fffffffffffffd08), !bVar1))
    break;
    __gnu_cxx::
    __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
    ::operator++(&local_20);
  }
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x30);
  __lhs = &local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"Undefined child mandatory tag: \"",__lhs);
  string_trait_t::from_ascii(in_stack_fffffffffffffce8);
  tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(local_30);
  std::operator+(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"\". Where parent is: \"",&local_1c9);
  string_trait_t::from_ascii(in_stack_fffffffffffffce8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"\". In file \"",&local_211);
  string_trait_t::from_ascii(in_stack_fffffffffffffce8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
  std::operator+(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  this_00 = (exception_t<cfgfile::string_trait_t> *)local_259;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_259 + 1),"\" on line ",(allocator *)this_00);
  string_trait_t::from_ascii(in_stack_fffffffffffffce8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  what = (string_t *)parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
  string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffce8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  paVar4 = &local_2c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,".",paVar4);
  string_trait_t::from_ascii(in_stack_fffffffffffffce8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  exception_t<cfgfile::string_trait_t>::exception_t(this_00,what);
  __cxa_throw(__rhs,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() +
					Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}